

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::min(quadratic_cost_type<double> *this,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (n == 0) {
    auVar7 = ZEXT1664(ZEXT816(0x7fefffffffffffff));
  }
  else {
    auVar7 = ZEXT1664(ZEXT816(0x7fefffffffffffff));
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    uVar4 = 0;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar4];
      uVar4 = uVar4 + 1;
      auVar9 = vandpd_avx(auVar10,auVar8);
      uVar1 = vcmppd_avx512vl(auVar10,ZEXT816(0) << 0x40,4);
      uVar2 = vcmppd_avx512vl(auVar9,auVar7._0_16_,1);
      bVar3 = (byte)uVar1 & 3 & (byte)uVar2 & 3;
      auVar7 = ZEXT1664(CONCAT88(auVar7._8_8_,
                                 (ulong)(bVar3 & 1) * auVar9._0_8_ +
                                 (ulong)!(bool)(bVar3 & 1) * auVar7._0_8_));
    } while ((uint)n != uVar4);
  }
  dVar6 = auVar7._0_8_;
  uVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar4 != 0) {
    auVar9._8_8_ = 0x7fffffffffffffff;
    auVar9._0_8_ = 0x7fffffffffffffff;
    lVar5 = 0;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           *(ulong *)((long)&((this->quadratic_elements)._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                             ._M_head_impl)->factor + lVar5);
      lVar5 = lVar5 + 0x10;
      auVar8 = vandpd_avx(auVar11,auVar9);
      uVar1 = vcmppd_avx512vl(auVar11,ZEXT816(0) << 0x40,4);
      uVar2 = vcmppd_avx512vl(auVar8,auVar7._0_16_,1);
      bVar3 = (byte)uVar1 & 3 & (byte)uVar2 & 3;
      dVar6 = (double)((ulong)(bVar3 & 1) * auVar8._0_8_ + (ulong)!(bool)(bVar3 & 1) * auVar7._0_8_)
      ;
      auVar7 = ZEXT1664(CONCAT88(auVar7._8_8_,dVar6));
    } while (uVar4 << 4 != lVar5);
  }
  return dVar6;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }